

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall
GreaterEquation::genPattern
          (GreaterEquation *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  pointer *this_00;
  PatternExpression *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SleighError *this_01;
  allocator local_149;
  string local_148 [32];
  TokenPattern local_128;
  TokenPattern local_100;
  TokenPattern local_d8;
  long local_b0;
  intb val;
  intb lhsval;
  int local_8c;
  undefined1 local_88 [4];
  int4 count;
  vector<long,_std::allocator<long>_> cur;
  vector<long,_std::allocator<long>_> max;
  vector<long,_std::allocator<long>_> min;
  vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> semval;
  intb lhsmax;
  intb lhsmin;
  vector<TokenPattern,_std::allocator<TokenPattern>_> *ops_local;
  GreaterEquation *this_local;
  
  iVar3 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[10])();
  iVar4 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[0xb])();
  this_00 = &min.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>::vector
            ((vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> *)this_00);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &max.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_88);
  local_8c = 0;
  pPVar1 = (this->super_ValExpressEquation).rhs;
  (*pPVar1->_vptr_PatternExpression[4])(pPVar1,this_00);
  pPVar1 = (this->super_ValExpressEquation).rhs;
  (*pPVar1->_vptr_PatternExpression[5])
            (pPVar1,&max.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
             &cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::operator=
            ((vector<long,_std::allocator<long>_> *)local_88,
             (vector<long,_std::allocator<long>_> *)
             &max.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  do {
    local_b0 = PatternExpression::getSubValue
                         ((this->super_ValExpressEquation).rhs,
                          (vector<long,_std::allocator<long>_> *)local_88);
    for (val = CONCAT44(extraout_var,iVar3); val <= CONCAT44(extraout_var_00,iVar4); val = val + 1)
    {
      if (local_b0 < val) {
        if (local_8c == 0) {
          buildPattern(&local_d8,(this->super_ValExpressEquation).lhs,val,
                       (vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> *)
                       &min.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<long,_std::allocator<long>_> *)local_88);
          TokenPattern::operator=
                    (&(this->super_ValExpressEquation).super_PatternEquation.resultpattern,&local_d8
                    );
          TokenPattern::~TokenPattern(&local_d8);
        }
        else {
          buildPattern(&local_128,(this->super_ValExpressEquation).lhs,val,
                       (vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> *)
                       &min.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<long,_std::allocator<long>_> *)local_88);
          TokenPattern::doOr(&local_100,
                             &(this->super_ValExpressEquation).super_PatternEquation.resultpattern,
                             &local_128);
          TokenPattern::operator=
                    (&(this->super_ValExpressEquation).super_PatternEquation.resultpattern,
                     &local_100);
          TokenPattern::~TokenPattern(&local_100);
          TokenPattern::~TokenPattern(&local_128);
        }
        local_8c = local_8c + 1;
      }
    }
    bVar2 = advance_combo((vector<long,_std::allocator<long>_> *)local_88,
                          (vector<long,_std::allocator<long>_> *)
                          &max.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (vector<long,_std::allocator<long>_> *)
                          &cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  } while (bVar2);
  if (local_8c != 0) {
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_88);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               &cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               &max.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>::~vector
              ((vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> *)
               &min.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    return;
  }
  this_01 = (SleighError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"Greater than constraint is impossible to match",&local_149);
  SleighError::SleighError(this_01,(string *)local_148);
  __cxa_throw(this_01,&SleighError::typeinfo,SleighError::~SleighError);
}

Assistant:

void GreaterEquation::genPattern(const vector<TokenPattern> &ops) const

{
  intb lhsmin = lhs->minValue();
  intb lhsmax = lhs->maxValue();
  vector<const PatternValue *> semval;
  vector<intb> min;
  vector<intb> max;
  vector<intb> cur;
  int4 count=0;

  rhs->listValues(semval);
  rhs->getMinMax(min,max);
  cur = min;

  do {
    intb lhsval;
    intb val = rhs->getSubValue(cur);
    for(lhsval=lhsmin;lhsval<=lhsmax;++lhsval) {
      if (lhsval <= val) continue;
      if (count==0)
	resultpattern = buildPattern(lhs,lhsval,semval,cur);
      else
	resultpattern = resultpattern.doOr(buildPattern(lhs,lhsval,semval,cur));
      count += 1;
    }
  } while(advance_combo(cur,min,max));
  if (count == 0)
    throw SleighError("Greater than constraint is impossible to match");
}